

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

int test_layer<ncnn::Dropout>
              (int typeindex,ParamDict *pd,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *weights,
              Option *_opt,Mat *a,Mat *top_shape,float epsilon,_func_void_Dropout_ptr *func)

{
  int iVar1;
  Layer *pLVar2;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RCX;
  ParamDict *in_RDX;
  undefined8 in_RSI;
  Option *in_R8;
  Mat *in_R9;
  undefined4 in_XMM0_Da;
  _func_void_Dropout_ptr *unaff_retaddr;
  code *in_stack_00000008;
  Mat c_fp32;
  Mat a_bf16;
  Mat a4;
  Mat c;
  Mat b;
  ModelBinFromMatArray mb;
  Option opt;
  Layer *op;
  Option *in_stack_00000698;
  undefined4 in_stack_000006a0;
  int in_stack_000006a4;
  Mat *in_stack_000006a8;
  Mat *in_stack_000006b0;
  Mat *in_stack_fffffffffffffd78;
  Mat *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  size_type in_stack_fffffffffffffd98;
  undefined1 *puVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffda0;
  Option *in_stack_fffffffffffffdd0;
  Mat *in_stack_fffffffffffffdd8;
  Mat *in_stack_fffffffffffffde0;
  Layer *in_stack_fffffffffffffde8;
  Option *in_stack_fffffffffffffdf8;
  Mat *in_stack_fffffffffffffe00;
  Dropout *in_stack_fffffffffffffe08;
  Mat local_1c8;
  Mat local_188;
  Mat local_148;
  Mat local_108;
  Mat local_c8;
  undefined1 local_78 [16];
  undefined1 local_68 [26];
  byte local_4e;
  undefined1 local_4d;
  byte local_47;
  byte local_45;
  float epsilon_00;
  undefined4 in_stack_ffffffffffffffc8;
  Option *_opt_00;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *weights_00;
  int typeindex_00;
  int local_4;
  
  _opt_00 = in_R8;
  weights_00 = in_RCX;
  pLVar2 = ncnn::create_layer(in_stack_fffffffffffffd8c);
  iVar1 = (int)in_RCX;
  memcpy(local_68,weights_00,0x28);
  if (in_stack_00000008 != (code *)0x0) {
    (*in_stack_00000008)(pLVar2);
  }
  if ((pLVar2->support_vulkan & 1U) == 0) {
    local_4d = 0;
  }
  if ((pLVar2->support_packing & 1U) == 0) {
    local_47 = 0;
  }
  if ((pLVar2->support_bf16_storage & 1U) == 0) {
    local_45 = 0;
  }
  if ((local_4e & 1) != 0) {
    local_45 = 0;
  }
  if ((local_4e & 1) != 0) {
    local_47 = 0;
  }
  if (in_R9->dims != 0) {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&pLVar2->bottom_shapes,0);
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&pLVar2->top_shapes,0);
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
  }
  (*pLVar2->_vptr_Layer[2])(pLVar2,in_RSI);
  typeindex_00 = (int)in_RSI;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::data
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x119336);
  puVar3 = local_78;
  ncnn::ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  (*pLVar2->_vptr_Layer[3])(pLVar2,puVar3);
  (*pLVar2->_vptr_Layer[4])(pLVar2,local_68);
  ncnn::Mat::Mat(&local_c8);
  if ((pLVar2->support_inplace & 1U) == 0) {
    iVar1 = (int)local_68;
    ncnn::Layer::forward
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               in_stack_fffffffffffffdd0);
  }
  else {
    ncnn::Mat::clone(&local_108,(__fn *)_opt_00,(void *)0x0,iVar1,in_R8);
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    ncnn::Mat::~Mat((Mat *)0x1193de);
    ncnn::Dropout::forward_inplace
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  }
  ncnn::Mat::Mat(&local_148);
  ncnn::Mat::Mat(&local_188);
  if ((local_47 & 1) == 0) {
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
  }
  else {
    iVar1 = (int)local_68;
    ncnn::convert_packing(in_stack_000006b0,in_stack_000006a8,in_stack_000006a4,in_stack_00000698);
  }
  if ((local_45 & 1) != 0) {
    ncnn::Mat::Mat(&local_1c8);
    ncnn::cast_float32_to_bfloat16
              (in_stack_000006b0,in_stack_000006a8,
               (Option *)CONCAT44(in_stack_000006a4,in_stack_000006a0));
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    ncnn::Mat::~Mat((Mat *)0x119578);
  }
  if ((pLVar2->support_inplace & 1U) == 0) {
    (*pLVar2->_vptr_Layer[7])(pLVar2,&local_188,&local_148,local_68);
  }
  else {
    ncnn::Mat::clone((Mat *)&stack0xfffffffffffffdf8,(__fn *)&local_188,(void *)0x0,iVar1,in_R8);
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    ncnn::Mat::~Mat((Mat *)0x1195f1);
    (*pLVar2->_vptr_Layer[9])(pLVar2,&local_148,local_68);
  }
  if ((local_45 & 1) != 0) {
    ncnn::Mat::Mat((Mat *)&stack0xfffffffffffffdb8);
    ncnn::cast_bfloat16_to_float32
              (in_stack_000006b0,in_stack_000006a8,
               (Option *)CONCAT44(in_stack_000006a4,in_stack_000006a0));
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
               in_stack_fffffffffffffd80);
    ncnn::Mat::~Mat((Mat *)0x1196b9);
  }
  ncnn::Mat::~Mat((Mat *)0x1196eb);
  (*pLVar2->_vptr_Layer[5])(pLVar2,local_68);
  if (pLVar2 != (Layer *)0x0) {
    (*pLVar2->_vptr_Layer[1])();
  }
  epsilon_00 = (float)((ulong)pLVar2 >> 0x20);
  iVar1 = CompareMat((Mat *)c_fp32._40_8_,(Mat *)c_fp32.allocator,(float)c_fp32._28_4_);
  if (iVar1 == 0) {
    if (in_R9->dims == 0) {
      local_4 = test_layer<ncnn::Dropout>
                          (typeindex_00,in_RDX,weights_00,_opt_00,in_R9,
                           (Mat *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffc8),epsilon_00,
                           unaff_retaddr);
    }
    else {
      local_4 = 0;
    }
  }
  else {
    fprintf(_stderr,"test_layer failed cpu\n");
    local_4 = -1;
  }
  ncnn::Mat::~Mat((Mat *)0x119827);
  ncnn::Mat::~Mat((Mat *)0x119834);
  ncnn::ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x119841);
  return local_4;
}

Assistant:

int test_layer(int typeindex, const ncnn::ParamDict& pd, const std::vector<ncnn::Mat>& weights, const ncnn::Option& _opt, const ncnn::Mat& a, const ncnn::Mat& top_shape = ncnn::Mat(), float epsilon = 0.001, void (*func)(T*) = 0)
{
    ncnn::Layer* op = ncnn::create_layer(typeindex);
    ncnn::Option opt = _opt;

    if (func)
    {
        (*func)((T*)op);
    }

    if (!op->support_vulkan) opt.use_vulkan_compute = false;
    if (!op->support_packing) opt.use_packing_layout = false;
    if (!op->support_bf16_storage) opt.use_bf16_storage = false;

    if (opt.use_int8_inference) opt.use_bf16_storage = false;
    if (opt.use_int8_inference) opt.use_packing_layout = false;

#if NCNN_VULKAN
    ncnn::VulkanDevice* vkdev = ncnn::get_gpu_device();

    ncnn::VkWeightBufferAllocator g_weight_vkallocator(vkdev);
    ncnn::VkWeightStagingBufferAllocator g_weight_staging_vkallocator(vkdev);

    ncnn::VkAllocator* blob_vkallocator = vkdev->acquire_blob_allocator();
    ncnn::VkAllocator* staging_vkallocator = vkdev->acquire_staging_allocator();

    opt.blob_vkallocator = blob_vkallocator;
    opt.workspace_vkallocator = blob_vkallocator;
    opt.staging_vkallocator = staging_vkallocator;

    if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
    if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;

    op->vkdev = vkdev;
#endif // NCNN_VULKAN

    if (top_shape.dims)
    {
        op->bottom_shapes.resize(1);
        op->top_shapes.resize(1);
        op->bottom_shapes[0] = a;
        op->top_shapes[0] = top_shape;
    }

    op->load_param(pd);

    ncnn::ModelBinFromMatArray mb(weights.data());

    op->load_model(mb);

    op->create_pipeline(opt);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        ncnn::VkTransfer cmd(vkdev);

        ncnn::Option opt_upload = opt;
        opt_upload.blob_vkallocator = &g_weight_vkallocator;
        opt_upload.workspace_vkallocator = &g_weight_vkallocator;
        opt_upload.staging_vkallocator = &g_weight_staging_vkallocator;

        op->upload_model(cmd, opt_upload);

        cmd.submit_and_wait();
    }
#endif // NCNN_VULKAN

    ncnn::Mat b;
    if (op->support_inplace)
    {
        b = a.clone();
        ((T*)op)->T::forward_inplace(b, opt);
    }
    else
    {
        ((T*)op)->T::forward(a, b, opt);
    }

    ncnn::Mat c;
    {
        ncnn::Mat a4;
        if (opt.use_packing_layout)
        {
            ncnn::convert_packing(a, a4, 4, opt);
        }
        else
        {
            a4 = a;
        }

        if (opt.use_bf16_storage)
        {
            ncnn::Mat a_bf16;
            ncnn::cast_float32_to_bfloat16(a4, a_bf16, opt);
            a4 = a_bf16;
        }

        if (op->support_inplace)
        {
            c = a4.clone();
            op->forward_inplace(c, opt);
        }
        else
        {
            op->forward(a4, c, opt);
        }

        if (opt.use_bf16_storage)
        {
            ncnn::Mat c_fp32;
            ncnn::cast_bfloat16_to_float32(c, c_fp32, opt);
            c = c_fp32;
        }
    }

#if NCNN_VULKAN
    ncnn::Mat d;
    if (opt.use_vulkan_compute)
    {
        // pack
        ncnn::Mat a4;
        if (opt.use_shader_pack8)
        {
            ncnn::convert_packing(a, a4, 8, opt);
            if (a4.elempack != 8)
                ncnn::convert_packing(a, a4, 4, opt);
        }
        else
            ncnn::convert_packing(a, a4, 4, opt);

        // fp16
        ncnn::Mat a4_fp16;
        if (opt.use_fp16_storage || ((a4.elempack == 4 || a4.elempack == 8) && opt.use_fp16_packed))
        {
            ncnn::cast_float32_to_float16(a4, a4_fp16, opt);
        }
        else
        {
            a4_fp16 = a4;
        }

        // forward
        ncnn::VkCompute cmd(vkdev);

        // upload
        ncnn::VkMat a4_fp16_gpu;
        cmd.record_upload(a4_fp16, a4_fp16_gpu, opt);

        ncnn::VkMat d4_fp16_gpu;
        if (op->support_inplace)
        {
            op->forward_inplace(a4_fp16_gpu, cmd, opt);

            d4_fp16_gpu = a4_fp16_gpu;
        }
        else
        {
            op->forward(a4_fp16_gpu, d4_fp16_gpu, cmd, opt);
        }

        // download
        cmd.record_download(d4_fp16_gpu, d, opt);

        cmd.submit_and_wait();
    }
#endif // NCNN_VULKAN

    op->destroy_pipeline(opt);

    delete op;

#if NCNN_VULKAN
    vkdev->reclaim_blob_allocator(blob_vkallocator);
    vkdev->reclaim_staging_allocator(staging_vkallocator);
    g_weight_vkallocator.clear();
    g_weight_staging_vkallocator.clear();
#endif // NCNN_VULKAN

    if (CompareMat(b, c, epsilon) != 0)
    {
        fprintf(stderr, "test_layer failed cpu\n");
        return -1;
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute && CompareMat(b, d, epsilon) != 0)
    {
        fprintf(stderr, "test_layer failed gpu\n");
        return -1;
    }
#endif // NCNN_VULKAN

    if (top_shape.dims == 0)
        return test_layer<T>(typeindex, pd, weights, opt, a, b, epsilon, func);

    return 0;
}